

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::device_tree::collect_names(device_tree *this)

{
  shared_ptr<dtc::fdt::node> local_48;
  shared_ptr<dtc::fdt::node> local_38;
  undefined1 local_28 [8];
  node_path p;
  device_tree *this_local;
  
  p.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  node_path::node_path((node_path *)local_28);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>_>
  ::clear(&this->node_names);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>_>
  ::clear(&this->node_paths);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>_>
  ::clear(&this->ordered_node_paths);
  std::vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>::clear
            (&this->cross_references);
  std::vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>::clear
            (&this->fixups);
  std::shared_ptr<dtc::fdt::node>::shared_ptr(&local_38,(nullptr_t)0x0);
  std::shared_ptr<dtc::fdt::node>::shared_ptr(&local_48,&this->root);
  collect_names_recursive(this,&local_38,&local_48,(node_path *)local_28);
  std::shared_ptr<dtc::fdt::node>::~shared_ptr(&local_48);
  std::shared_ptr<dtc::fdt::node>::~shared_ptr(&local_38);
  node_path::~node_path((node_path *)local_28);
  return;
}

Assistant:

void
device_tree::collect_names()
{
	node_path p;
	node_names.clear();
	node_paths.clear();
	ordered_node_paths.clear();
	cross_references.clear();
	fixups.clear();
	collect_names_recursive(nullptr, root, p);
}